

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall
cppcms::widgets::select_multiple::add(select_multiple *this,message *opt,string *id,bool selected)

{
  element eStack_d8;
  
  element::element(&eStack_d8,id,opt,selected);
  std::
  vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
  ::emplace_back<cppcms::widgets::select_multiple::element>(&this->elements_,&eStack_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)eStack_d8.tr_option.plural_._M_dataplus._M_p != &eStack_d8.tr_option.plural_.field_2) {
    operator_delete(eStack_d8.tr_option.plural_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)eStack_d8.tr_option.context_._M_dataplus._M_p != &eStack_d8.tr_option.context_.field_2) {
    operator_delete(eStack_d8.tr_option.context_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)eStack_d8.tr_option.id_._M_dataplus._M_p != &eStack_d8.tr_option.id_.field_2) {
    operator_delete(eStack_d8.tr_option.id_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)eStack_d8.str_option._M_dataplus._M_p != &eStack_d8.str_option.field_2) {
    operator_delete(eStack_d8.str_option._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)eStack_d8.id._M_dataplus._M_p != &eStack_d8.id.field_2) {
    operator_delete(eStack_d8.id._M_dataplus._M_p);
  }
  return;
}

Assistant:

void select_multiple::add(locale::message const &opt,std::string const &id,bool selected)
{
	elements_.push_back(element(id,opt,selected));
}